

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O2

h2o_compress_context_t *
h2o_compress_brotli_open(h2o_mem_pool_t *pool,int quality,size_t estimated_content_length)

{
  size_t *this;
  h2o_compress_context_t *phVar1;
  
  phVar1 = (h2o_compress_context_t *)
           h2o_mem_alloc_shared(pool,0x50,anon_unknown.dwarf_1173f9::brotli_context::dispose);
  phVar1[1].name.base = (char *)0x0;
  this = &phVar1[1].name.len;
  brotli::BrotliParams::BrotliParams((BrotliParams *)this);
  phVar1[3].name.base = (char *)0x0;
  phVar1[2].name.len = 0;
  phVar1[2].transform =
       (_func_void_st_h2o_compress_context_t_ptr_h2o_iovec_t_ptr_size_t_h2o_send_state_t_h2o_iovec_t_ptr_ptr_size_t_ptr
        *)0x0;
  (phVar1->name).base = "br";
  (phVar1->name).len = 2;
  phVar1->transform = anon_unknown.dwarf_1173f9::brotli_context::_compress;
  *(int *)((long)&phVar1[1].name.len + 4) = quality;
  if (estimated_content_length != 0xffffffffffffffff) {
    anon_unknown.dwarf_1173f9::brotli_context::_update_lgwin
              ((BrotliParams *)this,estimated_content_length);
  }
  return phVar1;
}

Assistant:

h2o_compress_context_t *h2o_compress_brotli_open(h2o_mem_pool_t *pool, int quality, size_t estimated_content_length)
{
    brotli_context *ctx = static_cast<brotli_context *>(h2o_mem_alloc_shared(pool, sizeof(*ctx), brotli_context::dispose));
    return new (ctx) brotli_context(quality, estimated_content_length);
}